

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void * prf_array_append_int(void *id,int elem)

{
  uint uVar1;
  undefined4 in_ESI;
  void *in_RDI;
  array *arr;
  int *ptr;
  array *local_20;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  void *local_8;
  
  local_20 = id_to_array(in_RDI);
  local_8 = in_RDI;
  if (local_20->size <= *(uint *)&local_20->field_0x4 >> 4) {
    local_8 = prf_array_set_size((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                                 (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
    local_20 = id_to_array(local_8);
  }
  uVar1 = *(uint *)&local_20->field_0x4 >> 4;
  *(uint *)&local_20->field_0x4 = *(uint *)&local_20->field_0x4 & 0xf | (uVar1 + 1) * 0x10;
  *(undefined4 *)((long)local_8 + (ulong)uVar1 * 4) = in_ESI;
  return local_8;
}

Assistant:

void *
prf_array_append_int(void *id, int elem)
{
  int *ptr;
  array *arr; 
  
  arr = id_to_array(id);
  if (arr->numelem >= arr->size) {
    id = prf_array_set_size(id, arr->size<<1);
    arr = id_to_array(id);
  }
  ptr = (int*)id;
  ptr[arr->numelem++] = elem;
  return id;
}